

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.cpp
# Opt level: O2

void __thiscall
slang::ast::ClockingBlockSymbol::ClockingBlockSymbol
          (ClockingBlockSymbol *this,Compilation *compilation,string_view name,SourceLocation loc)

{
  (this->super_Symbol).kind = ClockingBlock;
  (this->super_Symbol).name._M_len = name._M_len;
  (this->super_Symbol).name._M_str = name._M_str;
  (this->super_Symbol).location = loc;
  (this->super_Symbol).originatingSyntax = (SyntaxNode *)0x0;
  (this->super_Symbol).parentScope = (Scope *)0x0;
  (this->super_Symbol).nextInScope = (Symbol *)0x0;
  (this->super_Symbol).indexInScope = 0;
  Scope::Scope(&this->super_Scope,compilation,&this->super_Symbol);
  this->event = (TimingControl *)0x0;
  (this->defaultInputSkew).super__Optional_base<slang::ast::ClockingSkew,_true,_true>._M_payload.
  super__Optional_payload_base<slang::ast::ClockingSkew>._M_engaged = false;
  (this->defaultOutputSkew).super__Optional_base<slang::ast::ClockingSkew,_true,_true>._M_payload.
  super__Optional_payload_base<slang::ast::ClockingSkew>._M_engaged = false;
  this->inputSkewSyntax = (ClockingSkewSyntax *)0x0;
  this->outputSkewSyntax = (ClockingSkewSyntax *)0x0;
  return;
}

Assistant:

ClockingBlockSymbol::ClockingBlockSymbol(Compilation& compilation, string_view name,
                                         SourceLocation loc) :
    Symbol(SymbolKind::ClockingBlock, name, loc),
    Scope(compilation, this) {
}